

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O3

void __thiscall
glu::Texture2DArray::Texture2DArray
          (Texture2DArray *this,RenderContext *context,ContextInfo *contextInfo,int numLevels,
          CompressedTexture *levels,TexDecompressionParams *decompressionParams)

{
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TextureFormat local_38;
  
  this->m_context = context;
  this->m_isCompressed = true;
  dVar1 = getGLFormat(levels->m_format);
  this->m_format = dVar1;
  local_38 = tcu::getUncompressedFormat(levels->m_format);
  tcu::Texture2DArray::Texture2DArray
            (&this->m_refTexture,&local_38,levels->m_width,levels->m_height,levels->m_depth);
  this->m_glTexture = 0;
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  iVar3 = (*contextInfo->_vptr_ContextInfo[10])(contextInfo,(ulong)this->m_format);
  if ((char)iVar3 != '\0') {
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x6f8))(1,&this->m_glTexture);
    dVar1 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
    checkError(dVar1,"glGenTextures() failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x238);
    loadCompressed(this,numLevels,levels,decompressionParams);
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Compressed texture format not supported","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x235);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

Texture2DArray::Texture2DArray (const RenderContext& context, const ContextInfo& contextInfo, int numLevels, const tcu::CompressedTexture* levels, const tcu::TexDecompressionParams& decompressionParams)
	: m_context			(context)
	, m_isCompressed	(true)
	, m_format			(getGLFormat(levels[0].getFormat()))
	, m_refTexture		(getUncompressedFormat(levels[0].getFormat()), levels[0].getWidth(), levels[0].getHeight(), levels[0].getDepth())
	, m_glTexture		(0)
{
	const glw::Functions& gl = context.getFunctions();

	if (!contextInfo.isCompressedTextureFormatSupported(m_format))
		throw tcu::NotSupportedError("Compressed texture format not supported", "", __FILE__, __LINE__);

	gl.genTextures(1, &m_glTexture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed");

	try
	{
		loadCompressed(numLevels, levels, decompressionParams);
	}
	catch (const std::exception&)
	{
		gl.deleteTextures(1, &m_glTexture);
		throw;
	}
}